

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcSystemFurnitureElementType *in;
  
  in = (IfcSystemFurnitureElementType *)operator_new(0x1b8);
  *(undefined ***)&(in->super_IfcFurnishingElementType).field_0x1a0 = &PTR__Object_00806870;
  *(undefined8 *)&in->field_0x1a8 = 0;
  *(char **)&in->field_0x1b0 = "IfcSystemFurnitureElementType";
  Assimp::IFC::Schema_2x3::IfcFurnishingElementType::IfcFurnishingElementType
            ((IfcFurnishingElementType *)in,&PTR_construction_vtable_24__00872b58);
  *(undefined ***)
   &(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject = &PTR__IfcSystemFurnitureElementType_00872a28;
  *(undefined ***)&(in->super_IfcFurnishingElementType).field_0x1a0 =
       &PTR__IfcSystemFurnitureElementType_00872b40;
  *(undefined ***)
   &(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x88 = &PTR__IfcSystemFurnitureElementType_00872a50;
  (in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject
  .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcSystemFurnitureElementType_00872a78;
  *(undefined ***)
   &(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xf0 = &PTR__IfcSystemFurnitureElementType_00872aa0;
  *(undefined ***)
   &(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       &PTR__IfcSystemFurnitureElementType_00872ac8;
  *(undefined ***)&(in->super_IfcFurnishingElementType).super_IfcElementType.field_0x180 =
       &PTR__IfcSystemFurnitureElementType_00872af0;
  *(undefined ***)&(in->super_IfcFurnishingElementType).super_IfcElementType.field_0x190 =
       &PTR__IfcSystemFurnitureElementType_00872b18;
  GenericFill<Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType>(db,params,in);
  return (Object *)
         (&(in->super_IfcFurnishingElementType).super_IfcElementType.super_IfcTypeProduct.
           super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcFurnishingElementType).super_IfcElementType.
                             super_IfcTypeProduct.super_IfcTypeObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }